

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_reader.cpp
# Opt level: O2

void __thiscall
duckdb::ParquetReader::ParquetReader
          (ParquetReader *this,ClientContext *context_p,ParquetOptions *parquet_options_p,
          shared_ptr<duckdb::ParquetFileMetadataCache,_true> *metadata_p)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  Allocator *pAVar3;
  string local_78;
  OpenFileInfo local_58;
  
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  OpenFileInfo::OpenFileInfo(&local_58,&local_78);
  BaseFileReader::BaseFileReader(&this->super_BaseFileReader,&local_58);
  OpenFileInfo::~OpenFileInfo(&local_58);
  ::std::__cxx11::string::~string((string *)&local_78);
  (this->super_BaseFileReader)._vptr_BaseFileReader = (_func_int **)&PTR__ParquetReader_017b33a8;
  CachingFileSystem::Get(&this->fs,context_p);
  pAVar3 = BufferAllocator::Get(context_p);
  this->allocator = pAVar3;
  (this->metadata).internal.
  super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar1 = (metadata_p->internal).
           super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (metadata_p->internal).
           super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (metadata_p->internal).
  super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->metadata).internal.
  super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  (this->metadata).internal.
  super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = p_Var2;
  (metadata_p->internal).
  super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  ParquetOptions::ParquetOptions(&this->parquet_options,parquet_options_p);
  (this->encryption_util).internal.
  super___shared_ptr<duckdb::EncryptionUtil,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->rows_read).super___atomic_base<unsigned_long>._M_i = 0;
  (this->root_schema).
  super_unique_ptr<duckdb::ParquetColumnSchema,_std::default_delete<duckdb::ParquetColumnSchema>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::ParquetColumnSchema,_std::default_delete<duckdb::ParquetColumnSchema>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ParquetColumnSchema_*,_std::default_delete<duckdb::ParquetColumnSchema>_>
  .super__Head_base<0UL,_duckdb::ParquetColumnSchema_*,_false>._M_head_impl =
       (ParquetColumnSchema *)0x0;
  (this->encryption_util).internal.
  super___shared_ptr<duckdb::EncryptionUtil,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->file_handle).
  super_unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>_>._M_t.
  super___uniq_ptr_impl<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::CachingFileHandle_*,_std::default_delete<duckdb::CachingFileHandle>_>
  .super__Head_base<0UL,_duckdb::CachingFileHandle_*,_false>._M_head_impl = (CachingFileHandle *)0x0
  ;
  InitializeSchema(this,(ClientContext *)parquet_options_p);
  return;
}

Assistant:

ParquetReader::ParquetReader(ClientContext &context_p, ParquetOptions parquet_options_p,
                             shared_ptr<ParquetFileMetadataCache> metadata_p)
    : BaseFileReader(string()), fs(CachingFileSystem::Get(context_p)), allocator(BufferAllocator::Get(context_p)),
      metadata(std::move(metadata_p)), parquet_options(std::move(parquet_options_p)), rows_read(0) {
	InitializeSchema(context_p);
}